

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O3

void portfwdmgr_config(PortFwdManager *mgr,Conf *conf)

{
  PortListener *ptr;
  LogContext *ctx;
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  Conf *pCVar5;
  undefined4 *puVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  ulong extraout_RAX;
  size_t sVar11;
  PortFwdRecord *pPVar12;
  PortFwdRecord *pPVar13;
  ssh_rportfwd *psVar14;
  int iVar15;
  byte bVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  ssh_rportfwd **ppsVar20;
  byte *s;
  bool bVar21;
  uint local_64;
  char *local_58;
  char *local_50;
  char *key;
  undefined4 local_3c;
  ulong local_38;
  ulong uVar10;
  
  if (mgr->conf != (Conf *)0x0) {
    conf_free(mgr->conf);
  }
  pCVar5 = conf_copy(conf);
  mgr->conf = pCVar5;
  puVar6 = (undefined4 *)index234(mgr->forwardings,0);
  if (puVar6 != (undefined4 *)0x0) {
    iVar15 = 1;
    do {
      *puVar6 = 0;
      puVar6 = (undefined4 *)index234(mgr->forwardings,iVar15);
      iVar15 = iVar15 + 1;
    } while (puVar6 != (undefined4 *)0x0);
  }
  pcVar7 = conf_get_str_strs(conf,0xb0,(char *)0x0,&key);
  while (pcVar7 != (char *)0x0) {
    bVar16 = *key;
    local_38 = (ulong)bVar16;
    if ((bVar16 - 0x34 < 0xe) && ((0x2005U >> (bVar16 - 0x34 & 0x1f) & 1) != 0)) {
      bVar16 = ((byte *)key)[1];
      s = (byte *)key + 1;
    }
    else {
      local_38 = 0x41;
      s = (byte *)key;
    }
    if ((bVar16 == 0x52) || (bVar16 == 0x4c)) {
      s = s + 1;
    }
    else {
      bVar16 = 0x4c;
    }
    pcVar8 = host_strchr((char *)s,0x3a);
    if (pcVar8 == (char *)0x0) {
      local_50 = (char *)0x0;
    }
    else {
      pcVar9 = dupprintf("%.*s",(ulong)(uint)((int)pcVar8 - (int)s),s);
      local_50 = host_strduptrim(pcVar9);
      safefree(pcVar9);
      s = (byte *)(pcVar8 + 1);
    }
    uVar2 = atoi((char *)s);
    uVar10 = (ulong)uVar2;
    local_64 = uVar2;
    if (uVar2 == 0) {
      local_64 = net_service_lookup((char *)s);
      uVar10 = (ulong)local_64;
      if (local_64 == 0) {
        local_64 = 0;
        logeventf(mgr->cl->logctx,"Service lookup failed for source port \"%s\"",s);
        uVar10 = extraout_RAX;
      }
    }
    if (((bVar16 == 0x4c) && (*pcVar7 == 'D')) && (pcVar7[1] == '\0')) {
      uVar4 = (undefined4)CONCAT71((int7)(uVar10 >> 8),1);
      uVar3 = 0xffffffff;
      bVar16 = 0x44;
      pcVar7 = (char *)0x0;
      local_58 = (char *)0x0;
LAB_00124b89:
      if (local_64 == 0) goto LAB_00124bf9;
      local_3c = uVar4;
      pPVar12 = (PortFwdRecord *)safemalloc(1,0x48,0);
      pPVar12->type = (uint)bVar16;
      pPVar12->saddr = local_50;
      pcVar8 = (char *)0x0;
      if (uVar2 == 0) {
        pcVar8 = dupstr((char *)s);
      }
      pPVar12->sserv = pcVar8;
      pPVar12->sport = local_64;
      pPVar12->daddr = local_58;
      if ((char)local_3c == '\0') {
        pcVar7 = dupstr(pcVar7);
      }
      else {
        pcVar7 = (char *)0x0;
      }
      pPVar12->dserv = pcVar7;
      pPVar12->dport = uVar3;
      pPVar12->local = (PortListener *)0x0;
      pPVar12->remote = (ssh_rportfwd *)0x0;
      iVar15 = (uint)((int)local_38 == 0x36) * 2;
      if ((int)local_38 == 0x34) {
        iVar15 = 1;
      }
      pPVar12->addressfamily = iVar15;
      pPVar13 = (PortFwdRecord *)add234(mgr->forwardings,pPVar12);
      if (pPVar13 == pPVar12) {
        pPVar12->status = CREATE;
      }
      else {
        if (pPVar13->status == DESTROY) {
          pPVar13->status = KEEP;
        }
        pfr_free(pPVar12);
      }
    }
    else {
      sVar11 = host_strcspn(pcVar7,":");
      local_58 = dupprintf("%.*s",sVar11 & 0xffffffff,pcVar7);
      pcVar7 = pcVar7 + ((sVar11 + 1) - (ulong)(pcVar7[sVar11] == '\0'));
      uVar3 = atoi(pcVar7);
      if (uVar3 != 0) {
        uVar4 = (undefined4)CONCAT71((uint7)(uint3)(uVar3 >> 8),1);
        goto LAB_00124b89;
      }
      uVar3 = net_service_lookup(pcVar7);
      if (uVar3 != 0) {
        uVar4 = 0;
        goto LAB_00124b89;
      }
      logeventf(mgr->cl->logctx,"Service lookup failed for destination port \"%s\"",pcVar7);
LAB_00124bf9:
      safefree(local_50);
      safefree(local_58);
    }
    pcVar7 = conf_get_str_strs(conf,0xb0,key,&key);
  }
  pPVar12 = (PortFwdRecord *)index234(mgr->forwardings,0);
  if (pPVar12 != (PortFwdRecord *)0x0) {
    iVar15 = 0;
    do {
      if (pPVar12->status == DESTROY) {
        pcVar7 = "dynamic";
        if (pPVar12->type == 0x52) {
          pcVar7 = "remote";
        }
        if (pPVar12->type == 0x4c) {
          pcVar7 = "local";
        }
        pcVar8 = pPVar12->saddr;
        bVar21 = pcVar8 == (char *)0x0;
        if (bVar21) {
          pcVar8 = anon_var_dwarf_323fc + 10;
        }
        pcVar9 = ":";
        if (bVar21) {
          pcVar9 = anon_var_dwarf_323fc + 10;
        }
        pcVar8 = dupprintf("%s port forwarding from %s%s%d",pcVar7,pcVar8,pcVar9,
                           (ulong)pPVar12->sport);
        pcVar7 = pcVar8;
        if (pPVar12->type != 0x44) {
          pcVar7 = dupprintf("%s to %s:%d",pcVar8,pPVar12->daddr,(ulong)pPVar12->dport);
          safefree(pcVar8);
        }
        logeventf(mgr->cl->logctx,"Cancelling %s",pcVar7);
        safefree(pcVar7);
        if (pPVar12->remote == (ssh_rportfwd *)0x0) {
          ptr = pPVar12->local;
          if (ptr != (PortListener *)0x0) {
            ppsVar20 = (ssh_rportfwd **)&pPVar12->local;
            (*ptr->s->vt->close)(ptr->s);
            safefree(ptr->hostname);
            safefree(ptr);
            goto LAB_00124db1;
          }
        }
        else {
          ppsVar20 = &pPVar12->remote;
          (*mgr->cl->vt->rportfwd_remove)(mgr->cl,pPVar12->remote);
LAB_00124db1:
          *ppsVar20 = (ssh_rportfwd *)0x0;
        }
        delpos234(mgr->forwardings,iVar15);
        pfr_free(pPVar12);
        iVar15 = iVar15 + -1;
      }
      iVar15 = iVar15 + 1;
      pPVar12 = (PortFwdRecord *)index234(mgr->forwardings,iVar15);
    } while (pPVar12 != (PortFwdRecord *)0x0);
  }
  pPVar12 = (PortFwdRecord *)index234(mgr->forwardings,0);
  if (pPVar12 != (PortFwdRecord *)0x0) {
    iVar15 = 1;
    do {
      if (pPVar12->status == CREATE) {
        pcVar7 = pPVar12->saddr;
        bVar21 = pcVar7 == (char *)0x0;
        if (bVar21) {
          pcVar7 = anon_var_dwarf_323fc + 10;
        }
        pcVar8 = ":";
        if (bVar21) {
          pcVar8 = anon_var_dwarf_323fc + 10;
        }
        pcVar9 = pPVar12->sserv;
        bVar21 = pcVar9 == (char *)0x0;
        if (bVar21) {
          pcVar9 = anon_var_dwarf_323fc + 10;
        }
        pcVar17 = "(";
        if (bVar21) {
          pcVar17 = anon_var_dwarf_323fc + 10;
        }
        pcVar19 = ")";
        if (bVar21) {
          pcVar19 = anon_var_dwarf_323fc + 10;
        }
        pcVar7 = dupprintf("%s%s%s%s%d%s",pcVar7,pcVar8,pcVar9,pcVar17,(ulong)pPVar12->sport,pcVar19
                          );
        pcVar8 = ")";
        if (pPVar12->type == 0x44) {
          pcVar8 = (char *)0x0;
LAB_00124f5e:
          pcVar9 = pfl_listen((char *)0x0,-1,pPVar12->saddr,pPVar12->sport,mgr->cl,conf,
                              &pPVar12->local,pPVar12->addressfamily);
          pcVar17 = anon_var_dwarf_323fc + 10;
          if (pPVar12->addressfamily == 2) {
            pcVar17 = "IPv6 ";
          }
          if (pPVar12->addressfamily == 1) {
            pcVar17 = "IPv4 ";
          }
          pcVar19 = " failed: ";
          if (pcVar9 == (char *)0x0) {
            pcVar19 = anon_var_dwarf_323fc + 10;
          }
          pcVar18 = pcVar9;
          if (pcVar9 == (char *)0x0) {
            pcVar18 = anon_var_dwarf_323fc + 10;
          }
          logeventf(mgr->cl->logctx,"Local %sport %s SOCKS dynamic forwarding%s%s",pcVar17,pcVar7,
                    pcVar19,pcVar18);
LAB_00124fde:
          if (pcVar9 != (char *)0x0) {
            safefree(pcVar9);
          }
        }
        else {
          pcVar9 = pPVar12->dserv;
          bVar21 = pcVar9 == (char *)0x0;
          if (bVar21) {
            pcVar9 = anon_var_dwarf_323fc + 10;
          }
          pcVar17 = "(";
          if (bVar21) {
            pcVar17 = anon_var_dwarf_323fc + 10;
          }
          if (bVar21) {
            pcVar8 = anon_var_dwarf_323fc + 10;
          }
          pcVar8 = dupprintf("%s:%s%s%d%s",pPVar12->daddr,pcVar9,pcVar17,(ulong)pPVar12->dport,
                             pcVar8);
          if (pPVar12->type == 0x44) goto LAB_00124f5e;
          if (pPVar12->type == 0x4c) {
            pcVar9 = pfl_listen(pPVar12->daddr,pPVar12->dport,pPVar12->saddr,pPVar12->sport,mgr->cl,
                                conf,&pPVar12->local,pPVar12->addressfamily);
            pcVar17 = anon_var_dwarf_323fc + 10;
            if (pPVar12->addressfamily == 2) {
              pcVar17 = "IPv6 ";
            }
            if (pPVar12->addressfamily == 1) {
              pcVar17 = "IPv4 ";
            }
            pcVar19 = " failed: ";
            if (pcVar9 == (char *)0x0) {
              pcVar19 = anon_var_dwarf_323fc + 10;
            }
            pcVar18 = pcVar9;
            if (pcVar9 == (char *)0x0) {
              pcVar18 = anon_var_dwarf_323fc + 10;
            }
            logeventf(mgr->cl->logctx,"Local %sport %s forwarding to %s%s%s",pcVar17,pcVar7,pcVar8,
                      pcVar19,pcVar18);
            goto LAB_00124fde;
          }
          pcVar9 = pPVar12->saddr;
          if (pcVar9 == (char *)0x0) {
            _Var1 = conf_get_bool(conf,0xaf);
            pcVar9 = "localhost";
            if (_Var1) {
              pcVar9 = anon_var_dwarf_323fc + 10;
            }
          }
          psVar14 = (*mgr->cl->vt->rportfwd_alloc)
                              (mgr->cl,pcVar9,pPVar12->sport,pPVar12->daddr,pPVar12->dport,
                               pPVar12->addressfamily,pcVar7,pPVar12,(ssh_sharing_connstate *)0x0);
          pPVar12->remote = psVar14;
          ctx = mgr->cl->logctx;
          if (psVar14 == (ssh_rportfwd *)0x0) {
            logeventf(ctx,"Duplicate remote port forwarding to %s:%d",pPVar12->daddr,
                      (ulong)pPVar12->dport);
            pfr_free(pPVar12);
          }
          else {
            logeventf(ctx,"Requesting remote port %s forward to %s",pcVar7,pcVar8);
          }
        }
        safefree(pcVar7);
        safefree(pcVar8);
      }
      pPVar12 = (PortFwdRecord *)index234(mgr->forwardings,iVar15);
      iVar15 = iVar15 + 1;
    } while (pPVar12 != (PortFwdRecord *)0x0);
  }
  return;
}

Assistant:

void portfwdmgr_config(PortFwdManager *mgr, Conf *conf)
{
    PortFwdRecord *pfr;
    int i;
    char *key, *val;

    if (mgr->conf)
        conf_free(mgr->conf);
    mgr->conf = conf_copy(conf);

    /*
     * Go through the existing port forwardings and tag them
     * with status==DESTROY. Any that we want to keep will be
     * re-enabled (status==KEEP) as we go through the
     * configuration and find out which bits are the same as
     * they were before.
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++)
        pfr->status = DESTROY;

    for (val = conf_get_str_strs(conf, CONF_portfwd, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, CONF_portfwd, key, &key)) {
        char *kp, *kp2, *vp, *vp2;
        char address_family, type;
        int sport, dport, sserv, dserv;
        char *sports, *dports, *saddr, *host;

        kp = key;

        address_family = 'A';
        type = 'L';
        if (*kp == 'A' || *kp == '4' || *kp == '6')
            address_family = *kp++;
        if (*kp == 'L' || *kp == 'R')
            type = *kp++;

        if ((kp2 = host_strchr(kp, ':')) != NULL) {
            /*
             * There's a colon in the middle of the source port
             * string, which means that the part before it is
             * actually a source address.
             */
            char *saddr_tmp = dupprintf("%.*s", (int)(kp2 - kp), kp);
            saddr = host_strduptrim(saddr_tmp);
            sfree(saddr_tmp);
            sports = kp2+1;
        } else {
            saddr = NULL;
            sports = kp;
        }
        sport = atoi(sports);
        sserv = 0;
        if (sport == 0) {
            sserv = 1;
            sport = net_service_lookup(sports);
            if (!sport) {
                logeventf(mgr->cl->logctx, "Service lookup failed for source"
                          " port \"%s\"", sports);
            }
        }

        if (type == 'L' && !strcmp(val, "D")) {
            /* dynamic forwarding */
            host = NULL;
            dports = NULL;
            dport = -1;
            dserv = 0;
            type = 'D';
        } else {
            /* ordinary forwarding */
            vp = val;
            vp2 = vp + host_strcspn(vp, ":");
            host = dupprintf("%.*s", (int)(vp2 - vp), vp);
            if (*vp2)
                vp2++;
            dports = vp2;
            dport = atoi(dports);
            dserv = 0;
            if (dport == 0) {
                dserv = 1;
                dport = net_service_lookup(dports);
                if (!dport) {
                    logeventf(mgr->cl->logctx,
                              "Service lookup failed for destination"
                              " port \"%s\"", dports);
                }
            }
        }

        if (sport && dport) {
            /* Set up a description of the source port. */
            pfr = snew(PortFwdRecord);
            pfr->type = type;
            pfr->saddr = saddr;
            pfr->sserv = sserv ? dupstr(sports) : NULL;
            pfr->sport = sport;
            pfr->daddr = host;
            pfr->dserv = dserv ? dupstr(dports) : NULL;
            pfr->dport = dport;
            pfr->local = NULL;
            pfr->remote = NULL;
            pfr->addressfamily = (address_family == '4' ? ADDRTYPE_IPV4 :
                                  address_family == '6' ? ADDRTYPE_IPV6 :
                                  ADDRTYPE_UNSPEC);

            PortFwdRecord *existing = add234(mgr->forwardings, pfr);
            if (existing != pfr) {
                if (existing->status == DESTROY) {
                    /*
                     * We already have a port forwarding up and running
                     * with precisely these parameters. Hence, no need
                     * to do anything; simply re-tag the existing one
                     * as KEEP.
                     */
                    existing->status = KEEP;
                }
                /*
                 * Anything else indicates that there was a duplicate
                 * in our input, which we'll silently ignore.
                 */
                pfr_free(pfr);
            } else {
                pfr->status = CREATE;
            }
        } else {
            sfree(saddr);
            sfree(host);
        }
    }

    /*
     * Now go through and destroy any port forwardings which were
     * not re-enabled.
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++) {
        if (pfr->status == DESTROY) {
            char *message;

            message = dupprintf("%s port forwarding from %s%s%d",
                                pfr->type == 'L' ? "local" :
                                pfr->type == 'R' ? "remote" : "dynamic",
                                pfr->saddr ? pfr->saddr : "",
                                pfr->saddr ? ":" : "",
                                pfr->sport);

            if (pfr->type != 'D') {
                char *msg2 = dupprintf("%s to %s:%d", message,
                                       pfr->daddr, pfr->dport);
                sfree(message);
                message = msg2;
            }

            logeventf(mgr->cl->logctx, "Cancelling %s", message);
            sfree(message);

            /* pfr->remote or pfr->local may be NULL if setting up a
             * forwarding failed. */
            if (pfr->remote) {
                /*
                 * Cancel the port forwarding at the server
                 * end.
                 *
                 * Actually closing the listening port on the server
                 * side may fail - because in SSH-1 there's no message
                 * in the protocol to request it!
                 *
                 * Instead, we simply remove the record of the
                 * forwarding from our local end, so that any
                 * connections the server tries to make on it are
                 * rejected.
                 */
                ssh_rportfwd_remove(mgr->cl, pfr->remote);
                pfr->remote = NULL;
            } else if (pfr->local) {
                pfl_terminate(pfr->local);
                pfr->local = NULL;
            }

            delpos234(mgr->forwardings, i);
            pfr_free(pfr);
            i--;                       /* so we don't skip one in the list */
        }
    }

    /*
     * And finally, set up any new port forwardings (status==CREATE).
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++) {
        if (pfr->status == CREATE) {
            char *sportdesc, *dportdesc;
            sportdesc = dupprintf("%s%s%s%s%d%s",
                                  pfr->saddr ? pfr->saddr : "",
                                  pfr->saddr ? ":" : "",
                                  pfr->sserv ? pfr->sserv : "",
                                  pfr->sserv ? "(" : "",
                                  pfr->sport,
                                  pfr->sserv ? ")" : "");
            if (pfr->type == 'D') {
                dportdesc = NULL;
            } else {
                dportdesc = dupprintf("%s:%s%s%d%s",
                                      pfr->daddr,
                                      pfr->dserv ? pfr->dserv : "",
                                      pfr->dserv ? "(" : "",
                                      pfr->dport,
                                      pfr->dserv ? ")" : "");
            }

            if (pfr->type == 'L') {
                char *err = pfl_listen(pfr->daddr, pfr->dport,
                                       pfr->saddr, pfr->sport,
                                       mgr->cl, conf, &pfr->local,
                                       pfr->addressfamily);

                logeventf(mgr->cl->logctx,
                          "Local %sport %s forwarding to %s%s%s",
                          pfr->addressfamily == ADDRTYPE_IPV4 ? "IPv4 " :
                          pfr->addressfamily == ADDRTYPE_IPV6 ? "IPv6 " : "",
                          sportdesc, dportdesc,
                          err ? " failed: " : "", err ? err : "");
                if (err)
                    sfree(err);
            } else if (pfr->type == 'D') {
                char *err = pfl_listen(NULL, -1, pfr->saddr, pfr->sport,
                                       mgr->cl, conf, &pfr->local,
                                       pfr->addressfamily);

                logeventf(mgr->cl->logctx,
                          "Local %sport %s SOCKS dynamic forwarding%s%s",
                          pfr->addressfamily == ADDRTYPE_IPV4 ? "IPv4 " :
                          pfr->addressfamily == ADDRTYPE_IPV6 ? "IPv6 " : "",
                          sportdesc,
                          err ? " failed: " : "", err ? err : "");

                if (err)
                    sfree(err);
            } else {
                const char *shost;

                if (pfr->saddr) {
                    shost = pfr->saddr;
                } else if (conf_get_bool(conf, CONF_rport_acceptall)) {
                    shost = "";
                } else {
                    shost = "localhost";
                }

                pfr->remote = ssh_rportfwd_alloc(
                    mgr->cl, shost, pfr->sport, pfr->daddr, pfr->dport,
                    pfr->addressfamily, sportdesc, pfr, NULL);

                if (!pfr->remote) {
                    logeventf(mgr->cl->logctx,
                              "Duplicate remote port forwarding to %s:%d",
                              pfr->daddr, pfr->dport);
                    pfr_free(pfr);
                } else {
                    logeventf(mgr->cl->logctx, "Requesting remote port %s"
                              " forward to %s", sportdesc, dportdesc);
                }
            }
            sfree(sportdesc);
            sfree(dportdesc);
        }
    }
}